

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall
HEkk::initialiseBound(HEkk *this,SimplexAlgorithm algorithm,HighsInt solve_phase,bool perturb)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  double *pdVar5;
  reference pvVar6;
  reference pvVar7;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar8;
  double dVar9;
  double dVar10;
  HighsInt iCol;
  HighsInt num_tot;
  double inf;
  HighsInt iVar_2;
  HighsInt iRow;
  double random_value;
  bool fixed;
  double upper;
  double lower;
  HighsInt iVar_1;
  double base;
  double abs_upper;
  double abs_lower;
  HighsInt iVar;
  double max_abs_upper;
  double min_abs_upper;
  double max_abs_lower;
  double min_abs_lower;
  HighsInt num_tot_1;
  HighsInt num_row;
  HighsInt num_col;
  HEkk *in_stack_ffffffffffffff30;
  int local_a0;
  int local_8c;
  double local_78;
  double local_70;
  int local_64;
  value_type local_58;
  double local_50;
  int local_44;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  int local_20;
  int local_1c;
  int local_18;
  byte local_11;
  int local_10;
  int local_c;
  
  local_11 = in_CL & 1;
  local_10 = in_EDX;
  local_c = in_ESI;
  initialiseLpColBound(in_stack_ffffffffffffff30);
  initialiseLpRowBound(in_stack_ffffffffffffff30);
  *(undefined1 *)(in_RDI + 0x28d6) = 0;
  if (local_c == 1) {
    if (((local_11 & 1) != 0) &&
       ((*(double *)(in_RDI + 0x2828) != 0.0 || (NAN(*(double *)(in_RDI + 0x2828)))))) {
      local_18 = *(int *)(in_RDI + 0x2198);
      local_1c = *(int *)(in_RDI + 0x219c);
      local_20 = local_18 + local_1c;
      local_28 = INFINITY;
      local_30 = -1.0;
      local_38 = INFINITY;
      local_40 = -1.0;
      for (local_44 = 0; local_44 < local_20; local_44 = local_44 + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                            (long)local_44);
        local_50 = ABS(*pvVar4);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                            (long)local_44);
        local_58 = ABS(*pvVar4);
        if (((local_50 != 0.0) || (NAN(local_50))) && (local_50 < INFINITY)) {
          pdVar5 = std::min<double>(&local_50,&local_28);
          local_28 = *pdVar5;
          pdVar5 = std::max<double>(&local_50,&local_30);
          local_30 = *pdVar5;
        }
        if (((local_58 != 0.0) || (NAN(local_58))) && (local_58 < INFINITY)) {
          pdVar5 = std::min<double>(&local_58,&local_38);
          local_38 = *pdVar5;
          pdVar5 = std::max<double>(&local_58,&local_40);
          local_40 = *pdVar5;
        }
      }
      dVar8 = *(double *)(in_RDI + 0x2828) * 5e-07;
      for (local_64 = 0; local_64 < local_20; local_64 = local_64 + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                            (long)local_64);
        local_70 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                            (long)local_64);
        local_78 = *pvVar4;
        pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2990),
                            (long)local_64);
        if ((*pvVar6 != '\x01') || (local_70 != local_78)) {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2680),
                              (long)local_64);
          dVar10 = *pvVar4;
          if (-INFINITY < local_70) {
            if (-1.0 <= local_70) {
              if (1.0 <= local_70) {
                dVar9 = -(dVar10 * dVar8) * local_70;
              }
              else {
                dVar9 = -dVar10 * dVar8;
              }
            }
            else {
              dVar9 = -(dVar10 * dVar8) * -local_70;
            }
            local_70 = dVar9 + local_70;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                                (long)local_64);
            *pvVar4 = local_70;
          }
          if (local_78 < INFINITY) {
            if (-1.0 <= local_78) {
              if (1.0 <= local_78) {
                dVar10 = dVar10 * dVar8 * local_78;
              }
              else {
                dVar10 = dVar10 * dVar8;
              }
            }
            else {
              dVar10 = dVar10 * dVar8 * -local_78;
            }
            local_78 = dVar10 + local_78;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                                (long)local_64);
            *pvVar4 = local_78;
          }
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                              (long)local_64);
          dVar10 = *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                              (long)local_64);
          dVar9 = *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25d8),
                              (long)local_64);
          *pvVar4 = dVar10 - dVar9;
          pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                             ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2990)
                              ,(long)local_64);
          if (*pvVar6 != '\0') {
            pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)
                                (in_RDI + 0x29a8),(long)local_64);
            if (*pvVar6 < '\x01') {
              pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)
                                  (in_RDI + 0x29a8),(long)local_64);
              if (*pvVar6 < '\0') {
                pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                                    (long)local_64);
                *pvVar4 = local_78;
              }
            }
            else {
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                                  (long)local_64);
              *pvVar4 = local_70;
            }
          }
        }
      }
      for (local_8c = 0; local_8c < local_1c; local_8c = local_8c + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2978),(long)local_8c);
        iVar2 = *pvVar7;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),(long)iVar2
                           );
        vVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2638),
                            (long)local_8c);
        *pvVar4 = vVar1;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),(long)iVar2
                           );
        vVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2650),
                            (long)local_8c);
        *pvVar4 = vVar1;
      }
      *(undefined1 *)(in_RDI + 0x28d6) = 1;
    }
  }
  else if (local_10 != 2) {
    iVar2 = *(int *)(in_RDI + 0x2198);
    iVar3 = *(int *)(in_RDI + 0x219c);
    for (local_a0 = 0; local_a0 < iVar2 + iVar3; local_a0 = local_a0 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                          (long)local_a0);
      if ((*pvVar4 != -INFINITY) || (NAN(*pvVar4))) {
LAB_0076f5ac:
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                            (long)local_a0);
        if ((*pvVar4 != -INFINITY) || (NAN(*pvVar4))) {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                              (long)local_a0);
          if ((*pvVar4 != INFINITY) || (NAN(*pvVar4))) {
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                                (long)local_a0);
            *pvVar4 = 0.0;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                                (long)local_a0);
            *pvVar4 = 0.0;
          }
          else {
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                                (long)local_a0);
            *pvVar4 = 0.0;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                                (long)local_a0);
            *pvVar4 = 1.0;
          }
        }
        else {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                              (long)local_a0);
          *pvVar4 = -1.0;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                              (long)local_a0);
          *pvVar4 = 0.0;
        }
      }
      else {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                            (long)local_a0);
        if ((*pvVar4 != INFINITY) || (NAN(*pvVar4))) goto LAB_0076f5ac;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                            (long)local_a0);
        *pvVar4 = -1000.0;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                            (long)local_a0);
        *pvVar4 = 1000.0;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                          (long)local_a0);
      dVar8 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                          (long)local_a0);
      dVar10 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25d8),
                          (long)local_a0);
      *pvVar4 = dVar8 - dVar10;
    }
  }
  return;
}

Assistant:

void HEkk::initialiseBound(const SimplexAlgorithm algorithm,
                           const HighsInt solve_phase, const bool perturb) {
  initialiseLpColBound();
  initialiseLpRowBound();
  info_.bounds_perturbed = false;
  // Primal simplex bounds are either from the LP or perturbed
  if (algorithm == SimplexAlgorithm::kPrimal) {
    if (!perturb || info_.primal_simplex_bound_perturbation_multiplier == 0)
      return;
    // Perturb the bounds
    // Determine the smallest and largest finite lower/upper bounds
    HighsInt num_col = lp_.num_col_;
    HighsInt num_row = lp_.num_row_;
    HighsInt num_tot = num_col + num_row;
    double min_abs_lower = kHighsInf;
    double max_abs_lower = -1;
    double min_abs_upper = kHighsInf;
    double max_abs_upper = -1;
    for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
      double abs_lower = fabs(info_.workLower_[iVar]);
      double abs_upper = fabs(info_.workUpper_[iVar]);
      if (abs_lower && abs_lower < kHighsInf) {
        min_abs_lower = min(abs_lower, min_abs_lower);
        max_abs_lower = max(abs_lower, max_abs_lower);
      }
      if (abs_upper && abs_upper < kHighsInf) {
        min_abs_upper = min(abs_upper, min_abs_upper);
        max_abs_upper = max(abs_upper, max_abs_upper);
      }
    }
    // printf(
    //     "Nonzero finite lower bounds in [%9.4g, %9.4g]; upper bounds in "
    //     "[%9.4g, %9.4g]\n",
    //     min_abs_lower, max_abs_lower, min_abs_upper, max_abs_upper);

    const double base =
        info_.primal_simplex_bound_perturbation_multiplier * 5e-7;
    for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
      double lower = info_.workLower_[iVar];
      double upper = info_.workUpper_[iVar];
      const bool fixed = lower == upper;
      // Don't perturb bounds of nonbasic fixed variables as they stay nonbasic
      if (basis_.nonbasicFlag_[iVar] == kNonbasicFlagTrue && fixed) continue;
      double random_value = info_.numTotRandomValue_[iVar];
      if (lower > -kHighsInf) {
        if (lower < -1) {
          lower -= random_value * base * (-lower);
        } else if (lower < 1) {
          lower -= random_value * base;
        } else {
          lower -= random_value * base * lower;
        }
        info_.workLower_[iVar] = lower;
      }
      if (upper < kHighsInf) {
        if (upper < -1) {
          upper += random_value * base * (-upper);
        } else if (upper < 1) {
          upper += random_value * base;
        } else {
          upper += random_value * base * upper;
        }
        info_.workUpper_[iVar] = upper;
      }
      info_.workRange_[iVar] = info_.workUpper_[iVar] - info_.workLower_[iVar];
      if (basis_.nonbasicFlag_[iVar] == kNonbasicFlagFalse) continue;
      // Set values of nonbasic variables
      if (basis_.nonbasicMove_[iVar] > 0) {
        info_.workValue_[iVar] = lower;
      } else if (basis_.nonbasicMove_[iVar] < 0) {
        info_.workValue_[iVar] = upper;
      }
    }
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      HighsInt iVar = basis_.basicIndex_[iRow];
      info_.baseLower_[iRow] = info_.workLower_[iVar];
      info_.baseUpper_[iRow] = info_.workUpper_[iVar];
    }
    info_.bounds_perturbed = true;
    return;
  }
  // Dual simplex bounds are either from the LP or set to special values in
  // phase
  // 1
  assert(algorithm == SimplexAlgorithm::kDual);
  if (solve_phase == kSolvePhase2) return;

  // The dual objective is the sum of products of primal and dual
  // values for nonbasic variables. For dual simplex phase 1, the
  // primal bounds are set so that when the dual value is feasible, the
  // primal value is set to zero. Otherwise the value is +1/-1
  // according to the required sign of the dual, except for free
  // variables, where the bounds are [-1000, 1000]. Hence the dual
  // objective is the negation of the sum of infeasibilities, unless there are
  // free In Phase 1: change to dual phase 1 bound.
  const double inf = kHighsInf;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
    if (info_.workLower_[iCol] == -inf && info_.workUpper_[iCol] == inf) {
      // Phase 1 bounds were not modified for free rows in hsol. Why?
      // To reduce the number of free variables on the assumption that
      // free rows should never be nonbasic? This is normally true
      // when starting from a logical basis or crash - unless
      // singularity makes a free logical nonbasic - but what about an
      // advanced basis start? It doesn't happen with the HiGHS MIP
      // solver. However, SCIP cut handling can lead to a nonbasic row
      // with nonzero dual being made free and, particularly if it's
      // (then) the only dual infeasibility, phase 1 fails to remove
      // it.
      //
      // if (iCol >= lp_.num_col_) continue;
      info_.workLower_[iCol] = -1000,
      info_.workUpper_[iCol] = 1000;  // FREE
    } else if (info_.workLower_[iCol] == -inf) {
      info_.workLower_[iCol] = -1,
      info_.workUpper_[iCol] = 0;  // UPPER
    } else if (info_.workUpper_[iCol] == inf) {
      info_.workLower_[iCol] = 0,
      info_.workUpper_[iCol] = 1;  // LOWER
    } else {
      info_.workLower_[iCol] = 0,
      info_.workUpper_[iCol] = 0;  // BOXED or FIXED
    }
    info_.workRange_[iCol] = info_.workUpper_[iCol] - info_.workLower_[iCol];
  }
}